

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void glad_gl_load_GL_EXT_fog_coord(GLADuserptrloadfunc load,void *userptr)

{
  void *userptr_local;
  GLADuserptrloadfunc load_local;
  
  if (GLAD_GL_EXT_fog_coord != 0) {
    glad_glFogCoordPointerEXT = (PFNGLFOGCOORDPOINTEREXTPROC)(*load)("glFogCoordPointerEXT",userptr)
    ;
    glad_glFogCoordPointer = (PFNGLFOGCOORDPOINTERPROC)(*load)("glFogCoordPointer",userptr);
    glad_glFogCoorddEXT = (PFNGLFOGCOORDDEXTPROC)(*load)("glFogCoorddEXT",userptr);
    glad_glFogCoordf = (PFNGLFOGCOORDFPROC)(*load)("glFogCoordf",userptr);
    glad_glFogCoorddvEXT = (PFNGLFOGCOORDDVEXTPROC)(*load)("glFogCoorddvEXT",userptr);
    glad_glFogCoorddv = (PFNGLFOGCOORDDVPROC)(*load)("glFogCoorddv",userptr);
    glad_glFogCoordd = (PFNGLFOGCOORDDPROC)(*load)("glFogCoordd",userptr);
    glad_glFogCoordfv = (PFNGLFOGCOORDFVPROC)(*load)("glFogCoordfv",userptr);
    glad_glFogCoordfvEXT = (PFNGLFOGCOORDFVEXTPROC)(*load)("glFogCoordfvEXT",userptr);
    glad_glFogCoordfEXT = (PFNGLFOGCOORDFEXTPROC)(*load)("glFogCoordfEXT",userptr);
  }
  return;
}

Assistant:

static void glad_gl_load_GL_EXT_fog_coord( GLADuserptrloadfunc load, void* userptr) {
    if(!GLAD_GL_EXT_fog_coord) return;
    glFogCoordPointerEXT = (PFNGLFOGCOORDPOINTEREXTPROC) load("glFogCoordPointerEXT", userptr);
    glFogCoordPointer = (PFNGLFOGCOORDPOINTERPROC) load("glFogCoordPointer", userptr);
    glFogCoorddEXT = (PFNGLFOGCOORDDEXTPROC) load("glFogCoorddEXT", userptr);
    glFogCoordf = (PFNGLFOGCOORDFPROC) load("glFogCoordf", userptr);
    glFogCoorddvEXT = (PFNGLFOGCOORDDVEXTPROC) load("glFogCoorddvEXT", userptr);
    glFogCoorddv = (PFNGLFOGCOORDDVPROC) load("glFogCoorddv", userptr);
    glFogCoordd = (PFNGLFOGCOORDDPROC) load("glFogCoordd", userptr);
    glFogCoordfv = (PFNGLFOGCOORDFVPROC) load("glFogCoordfv", userptr);
    glFogCoordfvEXT = (PFNGLFOGCOORDFVEXTPROC) load("glFogCoordfvEXT", userptr);
    glFogCoordfEXT = (PFNGLFOGCOORDFEXTPROC) load("glFogCoordfEXT", userptr);
}